

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementInstancer.cpp
# Opt level: O0

ElementPtr __thiscall
Rml::ElementInstancerElement::InstanceElement
          (ElementInstancerElement *this,Element *param_1,String *tag,XMLAttributes *param_3)

{
  ElementInstancerPools *this_00;
  Element *__p;
  Element *ptr;
  XMLAttributes *param_3_local;
  String *tag_local;
  Element *param_1_local;
  ElementInstancerElement *this_local;
  
  this_00 = ControlledLifetimeResource<Rml::ElementInstancerPools>::operator->
                      ((ControlledLifetimeResource<Rml::ElementInstancerPools> *)
                       element_instancer_pools);
  __p = Pool<Rml::Element>::AllocateAndConstruct<std::__cxx11::string_const&>
                  (&this_00->pool_element,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)param_3);
  ::std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>::
  unique_ptr<Rml::Releaser<Rml::Element>,void>
            ((unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>> *)this,__p);
  return (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
         (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)this;
}

Assistant:

ElementPtr ElementInstancerElement::InstanceElement(Element* /*parent*/, const String& tag, const XMLAttributes& /*attributes*/)
{
	Element* ptr = element_instancer_pools->pool_element.AllocateAndConstruct(tag);
	return ElementPtr(ptr);
}